

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_test.cpp
# Opt level: O0

void __thiscall
FloatingPoint_AtomicFloat_Test::~FloatingPoint_AtomicFloat_Test
          (FloatingPoint_AtomicFloat_Test *this)

{
  void *in_RDI;
  
  ~FloatingPoint_AtomicFloat_Test((FloatingPoint_AtomicFloat_Test *)0x5b5448);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(FloatingPoint, AtomicFloat) {
    AtomicFloat af(0);
    Float f = 0.;
    EXPECT_EQ(f, af);
    af.Add(1.0251);
    f += 1.0251;
    EXPECT_EQ(f, af);
    af.Add(2.);
    f += 2.;
    EXPECT_EQ(f, af);
}